

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.cpp
# Opt level: O2

VRDatumPtr __thiscall MinVR::CreateVRDatumFloatArray(MinVR *this,void *pData)

{
  VRDatum_conflict *pValue;
  VRDatumPtrRC *extraout_RDX;
  VRDatumPtr VVar1;
  _Vector_base<float,_std::allocator<float>_> local_30;
  
  pValue = (VRDatum_conflict *)operator_new(0x68);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_30,
             (vector<float,_std::allocator<float>_> *)pData);
  VRDatumFloatArray::VRDatumFloatArray((VRDatumFloatArray *)pValue,(VRFloatArray *)&local_30);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_30);
  VRDatumPtr::VRDatumPtr((VRDatumPtr *)this,pValue);
  VVar1.reference = extraout_RDX;
  VVar1.pData = (VRDatum_conflict *)this;
  return VVar1;
}

Assistant:

VRDatumPtr CreateVRDatumFloatArray(void *pData) {
  VRDatumFloatArray *obj =
    new VRDatumFloatArray(*static_cast<VRFloatArray *>(pData));
  return VRDatumPtr(obj);
}